

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleVariableTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_2::SampleMaskCase::preDraw(SampleMaskCase *this)

{
  ostringstream *this_00;
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  RenderTarget *pRVar5;
  TestError *this_01;
  uint uVar6;
  Hex<4UL> local_1b0;
  undefined1 local_1a8 [16];
  TestLog local_198 [13];
  ios_base local_130 [264];
  long lVar4;
  
  iVar2 = (*((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
             super_MultisampleRenderCase.super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext
            [3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  bVar1 = true;
  if ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
      m_numRequestedSamples < 1) {
    if ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
        m_renderTarget == TARGET_DEFAULT) {
      pRVar5 = Context::getRenderTarget
                         ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                          super_MultisampleRenderCase.super_TestCase.m_context);
      bVar1 = 1 < pRVar5->m_numSamples;
    }
    else {
      bVar1 = false;
    }
  }
  uVar6 = ~(uint)(0xffffffffL <<
                 ((byte)(this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                        super_MultisampleRenderCase.m_numTargetSamples & 0x3f)) & 0x2aaaaaaa;
  (**(code **)(lVar4 + 0x5e0))(0x8e51);
  (**(code **)(lVar4 + 0x1258))(0,(ulong)uVar6);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"set mask",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSampleVariableTests.cpp"
                  ,0x495);
  local_1a8._0_8_ =
       ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
        super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_1a8 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Setting sample mask ",0x14)
  ;
  local_1b0.value = (ulong)uVar6;
  tcu::Format::Hex<4UL>::toStream(&local_1b0,(ostream *)this_00);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_130);
  if (bVar1) {
    iVar2 = (**(code **)(lVar4 + 0xb48))
                      ((((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                         super_MultisampleRenderCase.m_program)->m_program).m_program,"u_sampleMask"
                      );
    if (iVar2 == -1) {
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      local_1a8._0_8_ = local_198;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"Location of u_mask was -1","");
      tcu::TestError::TestError(this_01,(string *)local_1a8);
      __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (**(code **)(lVar4 + 0x1500))(iVar2,uVar6);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"set mask uniform",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSampleVariableTests.cpp"
                    ,0x4a1);
  }
  SampleMaskBaseCase::preDraw(&this->super_SampleMaskBaseCase);
  return;
}

Assistant:

void SampleMaskCase::preDraw (void)
{
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	const bool				multisampleTarget	= (m_numRequestedSamples > 0) || (m_renderTarget == TARGET_DEFAULT && m_context.getRenderTarget().getNumSamples() > 1);
	const deUint32			fullMask			= (deUint32)0xAAAAAAAAUL;
	const deUint32			maskMask			= (1U << m_numTargetSamples) - 1;
	const deUint32			effectiveMask		=  fullMask & maskMask;

	// set test mask
	gl.enable(GL_SAMPLE_MASK);
	gl.sampleMaski(0, effectiveMask);
	GLU_EXPECT_NO_ERROR(gl.getError(), "set mask");

	m_testCtx.getLog() << tcu::TestLog::Message << "Setting sample mask " << tcu::Format::Hex<4>(effectiveMask) << tcu::TestLog::EndMessage;

	// set multisample case uniforms
	if (multisampleTarget)
	{
		const int maskLoc = gl.getUniformLocation(m_program->getProgram(), "u_sampleMask");
		if (maskLoc == -1)
			throw tcu::TestError("Location of u_mask was -1");

		gl.uniform1ui(maskLoc, effectiveMask);
		GLU_EXPECT_NO_ERROR(gl.getError(), "set mask uniform");
	}

	// base class logic
	SampleMaskBaseCase::preDraw();
}